

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsBool helicsFederateIsAsyncOperationCompleted(HelicsFederate fed,HelicsError *err)

{
  bool bVar1;
  Federate *this;
  uint uVar2;
  
  this = getFed(fed,err);
  uVar2 = 0;
  if (this != (Federate *)0x0) {
    bVar1 = helics::Federate::isAsyncOperationCompleted(this);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

HelicsBool helicsFederateIsAsyncOperationCompleted(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return (fedObj->isAsyncOperationCompleted()) ? HELICS_TRUE : HELICS_FALSE;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
}